

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

string * __thiscall
duckdb::VectorTypeToString_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,VectorType type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "FLAT";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "FSST";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "CONSTANT";
    paVar1 = &local_d;
    break;
  case 3:
    pcVar2 = "DICTIONARY";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "SEQUENCE";
    paVar1 = &local_b;
    break;
  default:
    pcVar2 = "UNKNOWN";
    paVar1 = &local_e;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

string VectorTypeToString(VectorType type) {
	switch (type) {
	case VectorType::FLAT_VECTOR:
		return "FLAT";
	case VectorType::FSST_VECTOR:
		return "FSST";
	case VectorType::SEQUENCE_VECTOR:
		return "SEQUENCE";
	case VectorType::DICTIONARY_VECTOR:
		return "DICTIONARY";
	case VectorType::CONSTANT_VECTOR:
		return "CONSTANT";
	default:
		return "UNKNOWN";
	}
}